

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void mi_options_print(void)

{
  char *pcVar1;
  long lVar2;
  
  _mi_message("v%i.%i.%i%s%s (built on %s, %s)\n",2,2,3,", release",", git v8.0-207-g276608d9",
              "Apr 25 2025","23:30:26");
  lVar2 = 0;
  do {
    if (*(int *)((long)&options[0].init + lVar2) == 0) {
      mi_option_init((mi_option_desc_t *)((long)&options[0].value + lVar2));
    }
    pcVar1 = "";
    if (lVar2 == 0x2e0) {
      pcVar1 = "KiB";
    }
    if (lVar2 == 0x120) {
      pcVar1 = "KiB";
    }
    _mi_message("option \'%s\': %ld %s\n",*(undefined8 *)((long)&options[0].name + lVar2),
                *(undefined8 *)((long)&options[0].value + lVar2),pcVar1);
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x4a0);
  _mi_message("debug level : %d\n",0);
  _mi_message("secure level: %d\n",0);
  _mi_message("mem tracking: %s\n","none");
  return;
}

Assistant:

void mi_options_print(void) mi_attr_noexcept
{
  // show version
  const int vermajor = MI_MALLOC_VERSION/100;
  const int verminor = (MI_MALLOC_VERSION%100)/10;
  const int verpatch = (MI_MALLOC_VERSION%10);
  _mi_message("v%i.%i.%i%s%s (built on %s, %s)\n", vermajor, verminor, verpatch,
      #if defined(MI_CMAKE_BUILD_TYPE)
      ", " mi_stringify(MI_CMAKE_BUILD_TYPE)
      #else
      ""
      #endif
      ,
      #if defined(MI_GIT_DESCRIBE)
      ", git " mi_stringify(MI_GIT_DESCRIBE)
      #else
      ""
      #endif
      , __DATE__, __TIME__);

  // show options
  for (int i = 0; i < _mi_option_last; i++) {
    mi_option_t option = (mi_option_t)i;
    long l = mi_option_get(option); MI_UNUSED(l); // possibly initialize
    mi_option_desc_t* desc = &options[option];
    _mi_message("option '%s': %ld %s\n", desc->name, desc->value, (mi_option_has_size_in_kib(option) ? "KiB" : ""));
  }

  // show build configuration
  _mi_message("debug level : %d\n", MI_DEBUG );
  _mi_message("secure level: %d\n", MI_SECURE );
  _mi_message("mem tracking: %s\n", MI_TRACK_TOOL);
  #if MI_GUARDED
  _mi_message("guarded build: %s\n", mi_option_get(mi_option_guarded_sample_rate) != 0 ? "enabled" : "disabled");
  #endif
  #if MI_TSAN
  _mi_message("thread santizer enabled\n");
  #endif
}